

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcoder.c
# Opt level: O3

MapcodeError
decodeMapcodeToLatLonUtf8
          (double *latDeg,double *lonDeg,char *mapcode,Territory territory,
          MapcodeElements *mapcodeElements)

{
  MapcodeError MVar1;
  DecodeRec local_b8;
  
  MVar1 = ERR_BAD_ARGUMENTS;
  if (mapcode != (char *)0x0 && (lonDeg != (double *)0x0 && latDeg != (double *)0x0)) {
    memset(&local_b8,0,0x88);
    local_b8.mapcodeElements.territoryCode = TERRITORY_NONE;
    local_b8.orginput = mapcode;
    local_b8.context = territory;
    MVar1 = decoderEngine(&local_b8,0);
    *latDeg = local_b8.result.lat;
    *lonDeg = local_b8.result.lon;
    if (mapcodeElements != (MapcodeElements *)0x0) {
      *(undefined8 *)(mapcodeElements->precisionExtension + 4) = local_b8.mapcodeElements._32_8_;
      *(undefined8 *)(mapcodeElements->properMapcode + 4) =
           local_b8.mapcodeElements.properMapcode._4_8_;
      mapcodeElements->indexOfDot = local_b8.mapcodeElements.indexOfDot;
      mapcodeElements->precisionExtension[0] = local_b8.mapcodeElements.precisionExtension[0];
      mapcodeElements->precisionExtension[1] = local_b8.mapcodeElements.precisionExtension[1];
      mapcodeElements->precisionExtension[2] = local_b8.mapcodeElements.precisionExtension[2];
      mapcodeElements->precisionExtension[3] = local_b8.mapcodeElements.precisionExtension[3];
      *&mapcodeElements->territoryISO = local_b8.mapcodeElements.territoryISO;
      mapcodeElements->territoryCode = local_b8.mapcodeElements.territoryCode;
      mapcodeElements->properMapcode[0] = local_b8.mapcodeElements.properMapcode[0];
      mapcodeElements->properMapcode[1] = local_b8.mapcodeElements.properMapcode[1];
      mapcodeElements->properMapcode[2] = local_b8.mapcodeElements.properMapcode[2];
      mapcodeElements->properMapcode[3] = local_b8.mapcodeElements.properMapcode[3];
    }
  }
  return MVar1;
}

Assistant:

enum MapcodeError decodeMapcodeToLatLonUtf8(double *latDeg, double *lonDeg,
                                            const char *mapcode, enum Territory territory,
                                            MapcodeElements *mapcodeElements) {
    if ((latDeg == NULL) || (lonDeg == NULL) || (mapcode == NULL)) {
        return ERR_BAD_ARGUMENTS;
    } else {
        enum MapcodeError ret;
        DecodeRec dec = {
                {"", TERRITORY_NONE, "", 0, ""},
                0,
                0,
                0,
                TERRITORY_NONE,
                0,
                {0.0, 0.0},
                {0, 0},
                {0.0, 0.0, 0.0, 0.0}
        };
        dec.orginput = mapcode;
        dec.context = territory;

        ret = decoderEngine(&dec, 0);
        *latDeg = dec.result.lat;
        *lonDeg = dec.result.lon;

        if (mapcodeElements) {
            memcpy(mapcodeElements, &dec.mapcodeElements, sizeof(MapcodeElements));
        }
        return ret;
    }
}